

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_clone.c
# Opt level: O1

mpt_node * mpt_list_clone(mpt_node *src)

{
  bool bVar1;
  mpt_node *pmVar2;
  mpt_node *pmVar3;
  mpt_node *pmVar4;
  mpt_node *curr;
  mpt_node *position;
  
  if (src == (mpt_node *)0x0) {
LAB_00116b9d:
    curr = (mpt_node *)0x0;
  }
  else {
    position = (mpt_node *)0x0;
    curr = (mpt_node *)0x0;
    do {
      pmVar2 = mpt_node_clone(src);
      if (pmVar2 == (mpt_node *)0x0) {
LAB_00116b7c:
        while (curr != (mpt_node *)0x0) {
          pmVar2 = curr->next;
          mpt_node_unlink(curr);
          mpt_node_destroy(curr);
          curr = pmVar2;
        }
        bVar1 = false;
      }
      else {
        pmVar4 = pmVar2;
        pmVar3 = pmVar2;
        if (position != (mpt_node *)0x0) {
          pmVar3 = mpt_gnode_after(position,pmVar2);
          pmVar4 = curr;
        }
        bVar1 = true;
        curr = pmVar4;
        position = pmVar3;
        if (src->children != (mpt_node *)0x0) {
          pmVar4 = mpt_list_clone(src->children);
          pmVar2->children = pmVar4;
          if (pmVar4 != (mpt_node *)0x0) goto LAB_00116b7c;
        }
      }
      if (!bVar1) goto LAB_00116b9d;
      src = src->next;
    } while (src != (mpt_node *)0x0);
  }
  return curr;
}

Assistant:

extern MPT_STRUCT(node) *mpt_list_clone(const MPT_STRUCT(node) *src)
{
	MPT_STRUCT(node) *first = 0, *last = 0;
	
	for (; src; src = src->next) {
		MPT_STRUCT(node) *cpy;
		
		if ((cpy = mpt_node_clone(src))) {
			if (!last) {
				last = first = cpy;
			} else {
				last = mpt_gnode_after(last, cpy);
			}
			/* require empty or cloned subtree */
			if (!src->children
			    || !(cpy->children = mpt_list_clone(src->children))) {
				continue;
			}
		}
		for (cpy = first; cpy; cpy = first) {
			first = first->next;
			mpt_node_unlink(cpy);
			mpt_node_destroy(cpy);
		}
		return 0;
	}
	return first;
}